

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallFileSetGenerator.cxx
# Opt level: O1

void __thiscall
cmInstallFileSetGenerator::~cmInstallFileSetGenerator(cmInstallFileSetGenerator *this)

{
  ~cmInstallFileSetGenerator(this);
  operator_delete(this,0x128);
  return;
}

Assistant:

cmInstallFileSetGenerator::~cmInstallFileSetGenerator() = default;